

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPTrap.cpp
# Opt level: O3

bool __thiscall SNMPTrap::build(SNMPTrap *this)

{
  short sVar1;
  SNMP_VERSION SVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ComplexType *pCVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  OctetType *newObj;
  bool bVar4;
  shared_ptr<ComplexType> ourVBList;
  OctetType *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  undefined1 local_f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_f0 [2];
  undefined1 local_d9;
  undefined1 local_d8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  pointer local_58 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pCVar3 = (this->super_SNMPPacket).packet;
  if (pCVar3 != (ComplexType *)0x0) {
    (*(pCVar3->super_BER_CONTAINER)._vptr_BER_CONTAINER[1])();
  }
  if (this->trapOID == (OIDType *)0x0) {
    bVar4 = false;
  }
  else {
    pCVar3 = (ComplexType *)operator_new(0x28);
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(pCVar3->super_BER_CONTAINER)._type)->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x30;
    (pCVar3->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__ComplexType_00114f58;
    (pCVar3->values).
    super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pCVar3->values).
    super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pCVar3->values).
    super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->super_SNMPPacket).packet = pCVar3;
    SVar2 = (this->super_SNMPPacket).snmpVersion;
    p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    p_Stack_100->_M_use_count = 1;
    p_Stack_100->_M_weak_count = 1;
    p_Stack_100->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00115788;
    local_108 = (OctetType *)(p_Stack_100 + 1);
    p_Stack_100[1]._M_use_count = 2;
    p_Stack_100[1]._M_weak_count = 0;
    p_Stack_100[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BER_CONTAINER_00115568;
    *(SNMP_VERSION *)&p_Stack_100[2]._vptr__Sp_counted_base = SVar2;
    ComplexType::addValueToList
              ((ComplexType *)&stack0xffffffffffffffc0,(shared_ptr<BER_CONTAINER> *)pCVar3);
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
    }
    pCVar3 = (this->super_SNMPPacket).packet;
    local_58[0] = (pointer)(this->super_SNMPPacket).communityString._M_dataplus._M_p;
    local_f8 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OctetType,std::allocator<OctetType>,char_const*>
              (a_Stack_f0,(OctetType **)local_f8,(allocator<OctetType> *)&local_d9,(char **)local_58
              );
    local_108 = (OctetType *)local_f8;
    p_Stack_100 = a_Stack_f0[0]._M_pi;
    local_f8 = (undefined1  [8])0x0;
    a_Stack_f0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ComplexType::addValueToList((ComplexType *)(local_58 + 1),(shared_ptr<BER_CONTAINER> *)pCVar3);
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
    }
    if (a_Stack_f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_f0[0]._M_pi);
    }
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
    this_00->_M_use_count = 1;
    this_00->_M_weak_count = 1;
    this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00115828;
    this_00[1]._M_use_count = 0xa4;
    this_00[1]._M_weak_count = 0;
    this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ComplexType_00114f58;
    this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    this_00[2]._M_use_count = 0;
    this_00[2]._M_weak_count = 0;
    this_00[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    OIDType::cloneOID((OIDType *)local_f8);
    newObj = (OctetType *)(this_00 + 1);
    local_108 = (OctetType *)local_f8;
    p_Stack_100 = a_Stack_f0[0]._M_pi;
    local_f8 = (undefined1  [8])0x0;
    a_Stack_f0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ComplexType::addValueToList((ComplexType *)local_68,(shared_ptr<BER_CONTAINER> *)newObj);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    }
    if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
    }
    if (a_Stack_f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_f0[0]._M_pi);
    }
    p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
    p_Stack_100->_M_use_count = 1;
    p_Stack_100->_M_weak_count = 1;
    p_Stack_100->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00115998;
    local_108 = (OctetType *)(p_Stack_100 + 1);
    p_Stack_100[1]._M_use_count = 0x40;
    p_Stack_100[1]._M_weak_count = 0;
    p_Stack_100[1]._vptr__Sp_counted_base = (_func_int **)&PTR__NetworkAddress_00115518;
    p_Stack_100[2]._vptr__Sp_counted_base = (_func_int **)&PTR__IPAddress_00114ed8;
    p_Stack_100[2]._M_use_count = (_Atomic_word)(this->agentIP)._address;
    ComplexType::addValueToList((ComplexType *)local_78,(shared_ptr<BER_CONTAINER> *)newObj);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
    if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
    }
    p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    p_Stack_100->_M_use_count = 1;
    p_Stack_100->_M_weak_count = 1;
    p_Stack_100->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00115788;
    local_108 = (OctetType *)(p_Stack_100 + 1);
    sVar1 = this->genericTrap;
    p_Stack_100[1]._M_use_count = 2;
    p_Stack_100[1]._M_weak_count = 0;
    p_Stack_100[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BER_CONTAINER_00115568;
    *(int *)&p_Stack_100[2]._vptr__Sp_counted_base = (int)sVar1;
    ComplexType::addValueToList((ComplexType *)local_88,(shared_ptr<BER_CONTAINER> *)newObj);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
    if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
    }
    p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    p_Stack_100->_M_use_count = 1;
    p_Stack_100->_M_weak_count = 1;
    p_Stack_100->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00115788;
    local_108 = (OctetType *)(p_Stack_100 + 1);
    sVar1 = this->specificTrap;
    p_Stack_100[1]._M_use_count = 2;
    p_Stack_100[1]._M_weak_count = 0;
    p_Stack_100[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BER_CONTAINER_00115568;
    *(int *)&p_Stack_100[2]._vptr__Sp_counted_base = (int)sVar1;
    ComplexType::addValueToList((ComplexType *)local_98,(shared_ptr<BER_CONTAINER> *)newObj);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
    if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
    }
    if (this->uptimeCallback == (TimestampCallback *)0x0) {
      p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
      p_Stack_100->_M_use_count = 1;
      p_Stack_100->_M_weak_count = 1;
      p_Stack_100->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001159e8;
      local_108 = (OctetType *)(p_Stack_100 + 1);
      *(undefined4 *)&p_Stack_100[2]._vptr__Sp_counted_base = 0;
      p_Stack_100[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BER_CONTAINER_00114ff8;
      p_Stack_100[1]._M_use_count = 0x43;
      p_Stack_100[1]._M_weak_count = 0;
      ComplexType::addValueToList((ComplexType *)local_b8,(shared_ptr<BER_CONTAINER> *)newObj);
      this_01._M_pi = p_Stack_100;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
        this_01._M_pi = p_Stack_100;
      }
    }
    else {
      ValueCallback::getValueForCallback
                ((ValueCallback *)local_f8,&this->uptimeCallback->super_ValueCallback);
      if (a_Stack_f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (a_Stack_f0[0]._M_pi)->_M_use_count = (a_Stack_f0[0]._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (a_Stack_f0[0]._M_pi)->_M_use_count = (a_Stack_f0[0]._M_pi)->_M_use_count + 1;
        }
      }
      local_108 = (OctetType *)local_f8;
      p_Stack_100 = a_Stack_f0[0]._M_pi;
      ComplexType::addValueToList((ComplexType *)local_a8,(shared_ptr<BER_CONTAINER> *)newObj);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
      }
      this_01._M_pi = a_Stack_f0[0]._M_pi;
      if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
        this_01._M_pi = a_Stack_f0[0]._M_pi;
      }
    }
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
    }
    (*(this->super_SNMPPacket)._vptr_SNMPPacket[3])(&local_108,this);
    bVar4 = local_108 != (OctetType *)0x0;
    if (bVar4) {
      local_f8 = (undefined1  [8])local_108;
      a_Stack_f0[0]._M_pi = p_Stack_100;
      if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Stack_100->_M_use_count = p_Stack_100->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Stack_100->_M_use_count = p_Stack_100->_M_use_count + 1;
        }
      }
      ComplexType::addValueToList
                ((ComplexType *)(local_d8 + 0x10),(shared_ptr<BER_CONTAINER> *)newObj);
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
      }
      if (a_Stack_f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_f0[0]._M_pi);
      }
      pCVar3 = (this->super_SNMPPacket).packet;
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      local_f8 = (undefined1  [8])newObj;
      a_Stack_f0[0]._M_pi = this_00;
      ComplexType::addValueToList((ComplexType *)local_d8,(shared_ptr<BER_CONTAINER> *)pCVar3);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
      if (a_Stack_f0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_f0[0]._M_pi);
      }
    }
    if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return bVar4;
}

Assistant:

bool SNMPTrap::build(){
    // Building V1 Traps
    delete packet;

    if(!this->trapOID) return false;

    packet = new ComplexType(STRUCTURE);

    packet->addValueToList(std::make_shared<IntegerType>((int)this->snmpVersion));
    packet->addValueToList(std::make_shared<OctetType>(this->communityString.c_str()));
    auto trapPDU = std::make_shared<ComplexType>(TrapPDU);
    
    trapPDU->addValueToList(trapOID->cloneOID());
    trapPDU->addValueToList(std::make_shared<NetworkAddress>(agentIP));
    trapPDU->addValueToList(std::make_shared<IntegerType>(genericTrap));
    trapPDU->addValueToList(std::make_shared<IntegerType>(specificTrap));
    
    if(uptimeCallback){
        trapPDU->addValueToList(std::static_pointer_cast<TimestampType>(ValueCallback::getValueForCallback(uptimeCallback)));
    } else {
        trapPDU->addValueToList(std::make_shared<TimestampType>(0));
    }

    auto ourVBList = this->generateVarBindList();
    if(!ourVBList) return false;
    
    trapPDU->addValueToList(ourVBList);
    packet->addValueToList(trapPDU);
    return true;
}